

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_(TimeInMillis ms)

{
  long in_RSI;
  string *in_RDI;
  tm *time_struct;
  time_t seconds;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  string local_220 [8];
  int *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [36];
  int local_17c;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [4];
  int in_stack_ffffffffffffff8c;
  string local_58 [55];
  allocator<char> local_21;
  tm *local_20;
  long local_18 [3];
  
  local_18[0] = in_RSI / 1000;
  local_20 = localtime(local_18);
  if (local_20 == (tm *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
               (allocator<char> *)in_stack_fffffffffffffdf0);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    local_17c = local_20->tm_year + 0x76c;
    __rhs = local_178;
    StreamableToString<int>(in_stack_fffffffffffffde8);
    std::operator+(in_stack_fffffffffffffdc8,(char *)__rhs);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff8c);
    std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::operator+(in_stack_fffffffffffffdc8,(char *)__rhs);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff8c);
    std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::operator+(in_stack_fffffffffffffdc8,(char *)__rhs);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff8c);
    std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::operator+(in_stack_fffffffffffffdc8,(char *)__rhs);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff8c);
    std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::operator+(in_stack_fffffffffffffdc8,(char *)__rhs);
    String::FormatIntWidth2_abi_cxx11_(in_stack_ffffffffffffff8c);
    std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
  }
  return in_RDI;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  // Using non-reentrant version as localtime_r is not portable.
  time_t seconds = static_cast<time_t>(ms / 1000);
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4996)  // Temporarily disables warning 4996
                                // (function or variable may be unsafe).
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
# pragma warning(pop)           // Restores the warning state again.
#else
  const struct tm* const time_struct = localtime(&seconds);  // NOLINT
#endif
  if (time_struct == NULL)
    return "";  // Invalid ms value

  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct->tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct->tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct->tm_mday) + "T" +
      String::FormatIntWidth2(time_struct->tm_hour) + ":" +
      String::FormatIntWidth2(time_struct->tm_min) + ":" +
      String::FormatIntWidth2(time_struct->tm_sec);
}